

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  lVar1 = xmlNewEntity(0);
  pcVar3 = "(null)";
  if (systemId != (xmlChar *)0x0) {
    uVar2 = xmlBuildURI(systemId,*ctx);
    *(undefined8 *)(lVar1 + 0x78) = uVar2;
    pcVar3 = (char *)systemId;
  }
  xmlHashAddEntry(*(undefined8 *)((long)ctx + (ulong)((type & 0xfffffffeU) == 4) * 8 + 8),name,lVar1
                 );
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"(null)";
  }
  if (content == (xmlChar *)0x0) {
    content = (xmlChar *)"(null)";
  }
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,(ulong)(uint)type,publicId,
          pcVar3,content);
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    debugContext *ctxt = ctx;
    xmlEntityPtr ent;
    const xmlChar *nullstr = BAD_CAST "(null)";

    ent = xmlNewEntity(NULL, name, type, publicId, systemId, content);
    if (systemId != NULL)
        ent->URI = xmlBuildURI(systemId, (const xmlChar *) ctxt->filename);

    if ((type == XML_INTERNAL_PARAMETER_ENTITY) ||
        (type == XML_EXTERNAL_PARAMETER_ENTITY))
        xmlHashAddEntry(ctxt->parameterEntities, name, ent);
    else
        xmlHashAddEntry(ctxt->generalEntities, name, ent);

    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}